

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void VmJsonDequoteString(SyString *pStr,jx9_value *pWorker)

{
  char *zString;
  bool bVar1;
  int local_34;
  char *pcStack_30;
  int c;
  char *zCur;
  char *zEnd;
  char *zIn;
  jx9_value *pWorker_local;
  SyString *pStr_local;
  
  zEnd = pStr->zString;
  zCur = pStr->zString + pStr->nByte;
  zIn = (char *)pWorker;
  pWorker_local = (jx9_value *)pStr;
  jx9_value_string(pWorker,"",0);
  while( true ) {
    zString = zEnd;
    pcStack_30 = zEnd;
    while( true ) {
      bVar1 = false;
      if (zEnd < zCur) {
        bVar1 = *zEnd != '\\';
      }
      if (!bVar1) break;
      zEnd = zEnd + 1;
    }
    if (zString < zEnd) {
      jx9_value_string((jx9_value *)zIn,zString,(int)zEnd - (int)zString);
    }
    zEnd = zEnd + 1;
    if (zCur <= zEnd) break;
    local_34 = (int)*zEnd;
    if (local_34 == 0x22) {
      jx9_value_string((jx9_value *)zIn,(char *)&local_34,1);
    }
    else if (local_34 == 0x5c) {
      jx9_value_string((jx9_value *)zIn,(char *)&local_34,1);
    }
    else if (local_34 == 0x66) {
      jx9_value_string((jx9_value *)zIn,"\f",1);
    }
    else if (local_34 == 0x6e) {
      jx9_value_string((jx9_value *)zIn,"\n",1);
    }
    else if (local_34 == 0x72) {
      jx9_value_string((jx9_value *)zIn,"\r",1);
    }
    else if (local_34 == 0x74) {
      jx9_value_string((jx9_value *)zIn,"\t",1);
    }
    else {
      jx9_value_string((jx9_value *)zIn,(char *)&local_34,1);
    }
    zEnd = zEnd + 1;
  }
  return;
}

Assistant:

static void VmJsonDequoteString(const SyString *pStr, jx9_value *pWorker)
{
	const char *zIn = pStr->zString;
	const char *zEnd = &pStr->zString[pStr->nByte];
	const char *zCur;
	int c;
	/* Mark the value as a string */
	jx9_value_string(pWorker, "", 0); /* Empty string */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append chunk verbatim */
			jx9_value_string(pWorker, zCur, (int)(zIn-zCur));
		}
		zIn++;
		if( zIn >= zEnd ){
			/* End of the input reached */
			break;
		}
		c = zIn[0];
		/* Unescape the character */
		switch(c){
		case '"':  jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char)); break;
		case '\\': jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char)); break;
		case 'n':  jx9_value_string(pWorker, "\n", (int)sizeof(char)); break;
		case 'r':  jx9_value_string(pWorker, "\r", (int)sizeof(char)); break;
		case 't':  jx9_value_string(pWorker, "\t", (int)sizeof(char)); break;
		case 'f':  jx9_value_string(pWorker, "\f", (int)sizeof(char)); break;
		default:
			jx9_value_string(pWorker, (const char *)&c, (int)sizeof(char));
			break;
		}
		/* Advance the stream cursor */
		zIn++;
	}
}